

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

uint8_t __thiscall Spi::flash_read_status(Spi *this)

{
  char *pcVar1;
  size_t sStack_30;
  uint8_t data [2];
  duration<long,_std::ratio<1L,_1000L>_> local_18;
  
  data[0] = '\x05';
  data[1] = '\0';
  flash_chip_select(this);
  xfer_spi(this,data,2);
  flash_chip_deselect(this);
  if (this->verbose == true) {
    fprintf(_stdout,"SR1: 0x%02X\n",(ulong)data[1]);
    pcVar1 = "locked";
    if (-1 < (short)data) {
      pcVar1 = "unlocked";
    }
    fprintf(_stdout," - SPRL: %s\n",pcVar1);
    pcVar1 = "Sequential Prog Mode";
    if (((ushort)data & 0x4000) == 0) {
      pcVar1 = "Byte/Page Prog Mode";
    }
    fprintf(_stdout," -  SPM: %s\n",pcVar1);
    pcVar1 = "Erase/Prog error";
    if (((ushort)data & 0x2000) == 0) {
      pcVar1 = "Erase/Prog success";
    }
    fprintf(_stdout," -  EPE: %s\n",pcVar1);
    pcVar1 = "~WP deasserted";
    if (((ushort)data & 0x1000) == 0) {
      pcVar1 = "~WP asserted";
    }
    fprintf(_stdout,"-  SPM: %s\n",pcVar1);
    fwrite(" -  SWP: ",9,1,_stdout);
    switch(data[1] >> 2 & 3) {
    case 0:
      pcVar1 = "All sectors unprotected\n";
      sStack_30 = 0x18;
      break;
    case 1:
      pcVar1 = "Some sectors protected\n";
      sStack_30 = 0x17;
      break;
    case 2:
      pcVar1 = "Reserved (xxxx 10xx)\n";
      sStack_30 = 0x15;
      break;
    case 3:
      pcVar1 = "All sectors protected\n";
      sStack_30 = 0x16;
    }
    fwrite(pcVar1,sStack_30,1,_stdout);
    pcVar1 = "Write enabled";
    if (((ushort)data & 0x200) == 0) {
      pcVar1 = "Not write enabled";
    }
    fprintf(_stdout," -  WEL: %s\n",pcVar1);
    pcVar1 = "Busy";
    if (((ushort)data & 0x100) == 0) {
      pcVar1 = "Ready";
    }
    fprintf(_stdout," - ~RDY: %s\n",pcVar1);
  }
  local_18.__r = 1;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_18);
  return data[1];
}

Assistant:

uint8_t Spi::flash_read_status() {
	uint8_t data[2] = { FC_RSR1 };

	flash_chip_select();
	xfer_spi(data, 2);
	flash_chip_deselect();

	if (verbose) {
		fprintf(stdout, "SR1: 0x%02X\n", data[1]);
		fprintf(stdout, " - SPRL: %s\n",
				((data[1] & (1 << 7)) == 0) ? "unlocked" : "locked");
		fprintf(stdout, " -  SPM: %s\n",
				((data[1] & (1 << 6)) == 0) ?
						"Byte/Page Prog Mode" : "Sequential Prog Mode");
		fprintf(stdout, " -  EPE: %s\n",
				((data[1] & (1 << 5)) == 0) ?
						"Erase/Prog success" : "Erase/Prog error");
		fprintf(stdout, "-  SPM: %s\n",
				((data[1] & (1 << 4)) == 0) ?
						"~WP asserted" : "~WP deasserted");
		fprintf(stdout, " -  SWP: ");
		switch ((data[1] >> 2) & 0x3) {
		case 0:
			fprintf(stdout, "All sectors unprotected\n");
			break;
		case 1:
			fprintf(stdout, "Some sectors protected\n");
			break;
		case 2:
			fprintf(stdout, "Reserved (xxxx 10xx)\n");
			break;
		case 3:
			fprintf(stdout, "All sectors protected\n");
			break;
		}
		fprintf(stdout, " -  WEL: %s\n",
				((data[1] & (1 << 1)) == 0) ?
						"Not write enabled" : "Write enabled");
		fprintf(stdout, " - ~RDY: %s\n",
				((data[1] & (1 << 0)) == 0) ? "Ready" : "Busy");
	}

	std::this_thread::sleep_for(std::chrono::milliseconds(1));
	return data[1];
}